

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execChkCmp2<(moira::Core)2,(moira::Instr)145,(moira::Mode)10,1>
          (Moira *this,u16 opcode)

{
  byte bVar1;
  PrefetchQueue PVar2;
  int iVar3;
  u32 uVar4;
  u32 uVar5;
  bool bVar6;
  bool bVar7;
  u32 data1;
  u32 ea;
  
  this->cp = 0;
  PVar2 = this->queue;
  readExt<(moira::Core)2>(this);
  readOp<(moira::Core)2,(moira::Mode)10,1,0ull>(this,opcode & 7,&ea,&data1);
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,1,0ull>(this,ea + 1);
  bVar1 = *(byte *)((long)&(this->reg).field_3 + (ulong)((uint)PVar2 >> 10 & 0x3c));
  uVar5 = (int)(char)bVar1;
  if ((short)PVar2.irc < 0) {
    uVar5 = (uint)bVar1;
  }
  if ((int)data1 < (int)uVar4) {
    bVar7 = (int)uVar5 < (int)data1;
    bVar6 = (int)uVar4 < (int)uVar5;
  }
  else {
    bVar7 = (int)uVar4 < (int)uVar5;
    bVar6 = (int)uVar5 < (int)data1;
  }
  (this->reg).sr.c = (bool)(bVar6 | bVar7);
  (this->reg).sr.z = uVar5 == uVar4 || uVar5 == data1;
  if ((((uint)PVar2 >> 0xb & 1) == 0) || ((bool)(bVar6 | bVar7) == false)) {
    prefetch<(moira::Core)2,4ull>(this);
    iVar3 = 0x17;
  }
  else {
    execException<(moira::Core)2>(this,CHK,0);
    iVar3 = 0x28;
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar3 + this->cp));
  return;
}

Assistant:

void
Moira::execChkCmp2(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    u32 ext = queue.irc;
    int src = _____________xxx(opcode);
    int dst = xxxx____________(ext);
    u32 ea, data1, data2;

    readExt<C>();

    readOp<C, M, S>(src, &ea, &data1);
    data2 = readM<C, M, S>(ea + S);

    if (MOIRA_MIMIC_MUSASHI) {

        auto bound1 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data1 : SEXT<S>(data1);
        auto bound2 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data2 : SEXT<S>(data2);
        i32 compare = readR<S>(dst);
        if (dst < 8) compare = SEXT<S>(compare);

        if (bound1 < bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare > bound2 || compare < bound1;
        }
        reg.sr.z = compare == bound1 || compare == bound2;

    } else {

        i32 bound1 = SEXT<S>(data1);
        i32 bound2 = SEXT<S>(data2);
        i32 compare = dst < 8 ? SEXT<S>(readR(dst)) : readR(dst);

        if (bound1 <= bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare < bound1 && compare > bound2;
        }
        reg.sr.z = compare == bound1 || compare == bound2;
        setUndefinedCHK2<C, S>(bound1, bound2, compare);
    }

    if ((ext & 0x800) && reg.sr.c) {

        execException<C>(M68kException::CHK);
        CYCLES_68020(40)

    } else {

        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DI   ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IX   ( 0,  0, 25,        0,  0, 25,        0,  0, 25)
        CYCLES_AW   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AL   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DIPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IXPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
    }

    FINALIZE
}